

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth_pbuf.c
# Opt level: O0

void csp_eth_pbuf_free(csp_eth_interface_data_t *ifdata,csp_packet_t *buffer,int buf_free,
                      int *task_woken)

{
  long in_RCX;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  csp_packet_t *prev;
  csp_packet_t *packet;
  void *packet_00;
  undefined8 local_28;
  
  packet_00 = (void *)0x0;
  for (local_28 = *(void **)(in_RDI + 0x78); local_28 != (void *)0x0;
      local_28 = *(void **)((long)local_28 + 0x38)) {
    if (local_28 == in_RSI) {
      if (packet_00 == (void *)0x0) {
        *(undefined8 *)(in_RDI + 0x78) = *(undefined8 *)((long)local_28 + 0x38);
      }
      else {
        *(undefined8 *)((long)packet_00 + 0x38) = *(undefined8 *)((long)local_28 + 0x38);
      }
      if (in_EDX != 0) {
        if (in_RCX == 0) {
          csp_buffer_free(packet_00);
        }
        else {
          csp_buffer_free_isr(packet_00);
        }
      }
    }
    packet_00 = local_28;
  }
  return;
}

Assistant:

void csp_eth_pbuf_free(csp_eth_interface_data_t * ifdata, csp_packet_t * buffer, int buf_free, int * task_woken) {

	csp_packet_t * packet = ifdata->pbufs;
	csp_packet_t * prev = NULL;

	while (packet) {

		/* Perform cleanup in used pbufs */
		if (packet == buffer) {

			/* Erase from list prev->next = next */
			if (prev) {
				prev->next = packet->next;
			} else {
				ifdata->pbufs = packet->next;
			}

			if (buf_free) {
				if (task_woken == NULL) {
					csp_buffer_free(packet);
				} else {
					csp_buffer_free_isr(packet);
				}
			}
		}

		prev = packet;
		packet = packet->next;
	}

}